

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncoder.h
# Opt level: O0

void __thiscall
o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder(SC3DMCEncoder<unsigned_short> *this)

{
  SC3DMCEncoder<unsigned_short> *this_local;
  
  if (this->m_normals != (Real *)0x0) {
    operator_delete__(this->m_normals);
  }
  if (this->m_quantFloatArray != (long *)0x0) {
    operator_delete__(this->m_quantFloatArray);
  }
  if (this->m_bufferAC != (uchar *)0x0) {
    operator_delete__(this->m_bufferAC);
  }
  SC3DMCStats::~SC3DMCStats(&this->m_stats);
  Vector<long>::~Vector(&this->m_predictors);
  TriangleListEncoder<unsigned_short>::~TriangleListEncoder(&this->m_triangleListEncoder);
  return;
}

Assistant:

~SC3DMCEncoder(void)
                                    {
                                        delete [] m_normals;
                                        delete [] m_quantFloatArray;
                                        delete [] m_bufferAC;
                                    }